

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cte.h
# Opt level: O2

void __thiscall merlin::cte::~cte(cte *this)

{
  edge *this_00;
  pointer ppeVar1;
  pointer ppeVar2;
  
  (this->super_graphical_model)._vptr_graphical_model = (_func_int **)&PTR__cte_001975b0;
  (this->super_algorithm)._vptr_algorithm = (_func_int **)&PTR__cte_00197648;
  for (ppeVar2 = (this->m_edges).
                 super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppeVar2 !=
      (this->m_edges).
      super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppeVar2 = ppeVar2 + 1) {
    this_00 = *ppeVar2;
    if (this_00 != (edge *)0x0) {
      detail::edge::~edge(this_00);
    }
    operator_delete(this_00);
  }
  ppeVar1 = (this->m_edges).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppeVar2 != ppeVar1) {
    (this->m_edges).
    super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppeVar1;
  }
  ppeVar2 = (this->m_messages).
            super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_messages).
      super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppeVar2) {
    (this->m_messages).
    super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppeVar2;
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_var2clique).super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::~_Vector_base
            (&(this->m_messages).
              super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>);
  std::_Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>::~_Vector_base
            (&(this->m_edges).
              super__Vector_base<merlin::detail::edge_*,_std::allocator<merlin::detail::edge_*>_>);
  std::vector<merlin::detail::node,_std::allocator<merlin::detail::node>_>::~vector
            (&this->m_clusters);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->m_evidence).super__Vector_base<int,_std::allocator<int>_>);
  factor::~factor(&this->m_marginal);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_query).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&this->m_beliefs);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_order).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  graphical_model::~graphical_model(&this->m_gmo);
  graphical_model::~graphical_model(&this->super_graphical_model);
  return;
}

Assistant:

~cte() {
		for (std::vector<detail::edge*>::iterator i = m_edges.begin();
				i != m_edges.end(); ++i) {
			delete *i;
		}
		m_edges.clear();
		m_messages.clear();
	}